

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O0

RtAudioErrorType __thiscall RtApi::error(RtApi *this,RtAudioErrorType type)

{
  bool bVar1;
  ostream *poVar2;
  allocator local_41;
  string local_40 [36];
  RtAudioErrorType local_1c;
  RtApi *pRStack_18;
  RtAudioErrorType type_local;
  RtApi *this_local;
  
  local_1c = type;
  pRStack_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"",&local_41);
  std::__cxx11::ostringstream::str((string *)&this->errorStream_);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if ((local_1c == RTAUDIO_WARNING) && ((this->showWarnings_ & 1U) == 0)) {
    this_local._4_4_ = local_1c;
  }
  else {
    bVar1 = std::function::operator_cast_to_bool((function *)&this->errorCallback_);
    if (bVar1) {
      std::
      function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(&this->errorCallback_,local_1c,&this->errorText_);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,'\n');
      poVar2 = std::operator<<(poVar2,(string *)&this->errorText_);
      std::operator<<(poVar2,"\n\n");
    }
    this_local._4_4_ = local_1c;
  }
  return this_local._4_4_;
}

Assistant:

RtAudioErrorType RtApi :: error( RtAudioErrorType type )
{
  errorStream_.str(""); // clear the ostringstream to avoid repeated messages

  // Don't output warnings if showWarnings_ is false
  if ( type == RTAUDIO_WARNING && showWarnings_ == false ) return type;
  
  if ( errorCallback_ ) {
    //const std::string errorMessage = errorText_;
    //errorCallback_( type, errorMessage );
    errorCallback_( type, errorText_ );
  }
  else
    std::cerr << '\n' << errorText_ << "\n\n";
  return type;
}